

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O0

bool FactoredDecPOMDPDiscrete::ConsistentVectorsOnSpecifiedScopes
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v1,Scope *scope1,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *v2,Scope *scope2)

{
  bool bVar1;
  Index IVar2;
  const_reference pvVar3;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  Index pos_in_v1;
  Index varI;
  Index v2_I;
  const_iterator s2_last;
  const_iterator s2_it;
  Index in_stack_0000017c;
  Scope *in_stack_00000180;
  undefined4 in_stack_ffffffffffffffa8;
  value_type in_stack_ffffffffffffffac;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  in_stack_ffffffffffffffb0;
  int iVar4;
  undefined4 in_stack_ffffffffffffffb8;
  uint local_3c;
  __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_30 [2];
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_10;
  
  local_20 = in_RDX;
  local_10 = in_RDI;
  local_30[0]._M_current =
       (uint *)std::vector<unsigned_int,_std::allocator<unsigned_int>_>::begin
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::end
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  local_3c = 0;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)in_stack_ffffffffffffffb0._M_current,
                       (__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                        *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    iVar4 = (int)((ulong)in_stack_ffffffffffffffb0._M_current >> 0x20);
    if (!bVar1) {
      return true;
    }
    __gnu_cxx::
    __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
    ::operator*(local_30);
    IVar2 = Scope::GetPositionForIndex(in_stack_00000180,in_stack_0000017c);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_10,(ulong)IVar2);
    in_stack_ffffffffffffffac = *pvVar3;
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_20,(ulong)local_3c);
    if (in_stack_ffffffffffffffac != *pvVar3) break;
    in_stack_ffffffffffffffb0 =
         __gnu_cxx::
         __normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
         ::operator++((__normal_iterator<const_unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                       *)CONCAT44(IVar2,in_stack_ffffffffffffffb8),iVar4);
    local_3c = local_3c + 1;
  }
  return false;
}

Assistant:

bool FactoredDecPOMDPDiscrete::
ConsistentVectorsOnSpecifiedScopes( 
                                        const std::vector<Index>& v1, 
                                        const Scope& scope1,
                                        const std::vector<Index>& v2,
                                        const Scope& scope2)
{
    Scope::const_iterator s2_it = scope2.begin();
    Scope::const_iterator s2_last = scope2.end();
    Index v2_I = 0;
    while(s2_it != s2_last)
    {
        //check that v1 specifies the same value for variable *s2_it
        Index varI = *s2_it;
        Index pos_in_v1 = scope1.GetPositionForIndex(varI);
        if(v1[pos_in_v1] != v2[v2_I] )
            return false;

        s2_it++;
        v2_I++;
    }
    return true;

}